

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fonts.h
# Opt level: O1

void __thiscall
dlib::font::compute_size<char,std::char_traits<char>,std::allocator<char>>
          (font *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          unsigned_long *width,unsigned_long *height,size_type first,size_type last)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  long lVar6;
  size_type i;
  ulong uVar7;
  
  *width = 0;
  *height = 0;
  if (str->_M_string_length != 0) {
    uVar7 = str->_M_string_length - 1;
    if (last != 0xffffffffffffffff) {
      uVar7 = last;
    }
    if (uVar7 < first) {
      lVar6 = 1;
      uVar5 = 0;
    }
    else {
      lVar6 = 0;
      uVar5 = 0;
      do {
        cVar1 = (str->_M_dataplus)._M_p[first];
        if (cVar1 != '\r') {
          if (cVar1 == '\n') {
            uVar4 = *width;
            if (*width <= uVar5) {
              uVar4 = uVar5;
            }
            lVar6 = lVar6 + 1;
            *width = uVar4;
            uVar5 = 0;
          }
          else {
            iVar2 = (*this->_vptr_font[3])();
            uVar5 = uVar5 + *(ushort *)(CONCAT44(extraout_var,iVar2) + 8);
          }
        }
        first = first + 1;
      } while (first <= uVar7);
      lVar6 = lVar6 + 1;
    }
    if (uVar5 < *width) {
      uVar5 = *width;
    }
    *width = uVar5;
    iVar2 = (*this->_vptr_font[4])(this);
    *height = CONCAT44(extraout_var_00,iVar2) * lVar6;
    iVar2 = (*this->_vptr_font[6])(this);
    iVar3 = (*this->_vptr_font[7])(this);
    *width = *width + CONCAT44(extraout_var_02,iVar3) + CONCAT44(extraout_var_01,iVar2);
  }
  return;
}

Assistant:

void compute_size (
            const std::basic_string<T,traits,alloc>& str,
            unsigned long& width,
            unsigned long& height,
            typename std::basic_string<T,traits,alloc>::size_type first = 0,
            typename std::basic_string<T,traits,alloc>::size_type last = (std::basic_string<T,traits,alloc>::npos)
        ) const
        {
            typedef std::basic_string<T,traits,alloc> string;
            DLIB_ASSERT ( (last == string::npos) || (first <= last && last < str.size())  ,
                          "\tvoid font::compute_size()"
                          << "\n\tlast == string::npos: " << ((last == string::npos)?"true":"false") 
                          << "\n\tfirst: " << (unsigned long)first 
                          << "\n\tlast:  " << (unsigned long)last 
                          << "\n\tstr.size():  " << (unsigned long)str.size() );

            unsigned long line_width = 0;
            unsigned long newlines = 0;
            width = 0;
            height = 0;

            if (str.size())
            {
                if (last == string::npos)
                    last = str.size()-1;
                const font& f = *this;

                for (typename string::size_type i = first; i <= last; ++i)
                {
                    // ignore '\r' characters
                    if (str[i] == '\r')
                        continue;

                    if (str[i] == '\n')
                    {
                        ++newlines;
                        width = std::max(width,line_width);
                        line_width = 0;
                    }
                    else
                    {
                        if (is_combining_char(str[i]) == false)
                            line_width += f[str[i]].width();
                    }
                }
                width = std::max(width,line_width);

                height = (newlines+1)*f.height();
                width += f.left_overflow() + f.right_overflow();
            }
        }